

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_x_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  int iVar1;
  uint uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  CONV_BUF_TYPE *pCVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  char cVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined2 uVar15;
  int iVar16;
  undefined2 uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  CONV_BUF_TYPE *pCVar21;
  uint16_t *puVar22;
  int iVar23;
  uint16_t *puVar24;
  CONV_BUF_TYPE *pCVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  uint16_t *puVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  __m256i coeffs_x [4];
  __m256i local_e0;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar38 [32];
  
  uVar3 = filter_params_x->taps;
  iVar23 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
  iVar16 = conv_params->round_0 + conv_params->round_1;
  cVar11 = (char)bd - (char)iVar16;
  uVar27 = 0xe - iVar16;
  auVar33 = ZEXT416(7 - conv_params->round_1);
  iVar16 = (1 << (cVar11 + 0xdU & 0x1f)) + (1 << (cVar11 + 0xeU & 0x1f));
  uVar17 = 0xff;
  if (bd == 0xc) {
    uVar17 = 0xfff;
  }
  uVar15 = 0x3ff;
  if (bd != 10) {
    uVar15 = uVar17;
  }
  iVar1 = conv_params->fwd_offset;
  iVar30 = conv_params->bck_offset;
  uVar2 = conv_params->round_0;
  pCVar6 = conv_params->dst;
  lVar28 = (long)conv_params->dst_stride;
  iVar4 = conv_params->do_average;
  iVar5 = conv_params->use_dist_wtd_comp_avg;
  prepare_coeffs(filter_params_x,subpel_x_qn,&local_e0);
  auVar12._4_4_ = iVar30;
  auVar12._0_4_ = iVar30;
  auVar12._8_4_ = iVar30;
  auVar12._12_4_ = iVar30;
  auVar12._16_4_ = iVar30;
  auVar12._20_4_ = iVar30;
  auVar12._24_4_ = iVar30;
  auVar12._28_4_ = iVar30;
  iVar30 = ((1 << ((byte)uVar27 & 0x1f)) >> 1) - iVar16;
  auVar34._4_4_ = iVar30;
  auVar34._0_4_ = iVar30;
  auVar34._8_4_ = iVar30;
  auVar34._12_4_ = iVar30;
  auVar34._16_4_ = iVar30;
  auVar34._20_4_ = iVar30;
  auVar34._24_4_ = iVar30;
  auVar34._28_4_ = iVar30;
  lVar18 = (long)dst_stride0;
  lVar19 = (long)src_stride;
  lVar26 = 0;
  auVar13._4_4_ = iVar1;
  auVar13._0_4_ = iVar1;
  auVar13._8_4_ = iVar1;
  auVar13._12_4_ = iVar1;
  auVar13._16_4_ = iVar1;
  auVar13._20_4_ = iVar1;
  auVar13._24_4_ = iVar1;
  auVar13._28_4_ = iVar1;
  for (lVar32 = 0; lVar32 < w; lVar32 = lVar32 + 8) {
    pCVar21 = pCVar6 + lVar28;
    puVar22 = dst0;
    puVar24 = dst0 + lVar18;
    pCVar25 = pCVar6;
    puVar29 = src + (1 - (ulong)(uVar3 >> 1));
    lVar31 = (long)src + (lVar19 * 2 - (ulong)(uVar3 & 0xfffffffe)) + 2;
    for (lVar20 = 0; lVar20 < h; lVar20 = lVar20 + 2) {
      auVar9 = vperm2i128_avx2(*(undefined1 (*) [32])((long)puVar29 + lVar26),
                               *(undefined1 (*) [32])(lVar31 + lVar26),0x20);
      auVar10 = vperm2i128_avx2(*(undefined1 (*) [32])((long)puVar29 + lVar26),
                                *(undefined1 (*) [32])(lVar31 + lVar26),0x31);
      auVar35 = vpalignr_avx2(auVar10,auVar9,4);
      auVar36 = vpalignr_avx2(auVar10,auVar9,8);
      auVar38 = vpalignr_avx2(auVar10,auVar9,0xc);
      auVar40 = vpmaddwd_avx2(auVar9,(undefined1  [32])local_e0);
      auVar7 = vpmaddwd_avx2(auVar35,local_c0);
      auVar35 = vpmaddwd_avx2(auVar36,local_a0);
      auVar36 = vpmaddwd_avx2(auVar38,local_80);
      auVar35 = vpaddd_avx2(auVar35,auVar36);
      auVar14._4_4_ = iVar23;
      auVar14._0_4_ = iVar23;
      auVar14._8_4_ = iVar23;
      auVar14._12_4_ = iVar23;
      auVar14._16_4_ = iVar23;
      auVar14._20_4_ = iVar23;
      auVar14._24_4_ = iVar23;
      auVar14._28_4_ = iVar23;
      auVar36 = vpaddd_avx2(auVar40,auVar14);
      auVar36 = vpaddd_avx2(auVar36,auVar7);
      auVar35 = vpaddd_avx2(auVar35,auVar36);
      auVar8 = vpsrad_avx2(auVar35,ZEXT416(uVar2));
      auVar35 = vpalignr_avx2(auVar10,auVar9,2);
      auVar36 = vpalignr_avx2(auVar10,auVar9,6);
      auVar38 = vpalignr_avx2(auVar10,auVar9,10);
      auVar40 = vpalignr_avx2(auVar10,auVar9,0xe);
      auVar7 = vpmaddwd_avx2(auVar35,(undefined1  [32])local_e0);
      auVar35 = vpmaddwd_avx2(auVar36,local_c0);
      auVar36 = vpmaddwd_avx2(auVar38,local_a0);
      auVar35 = vpaddd_avx2(auVar35,auVar36);
      auVar38 = vpmaddwd_avx2(auVar40,local_80);
      auVar36 = vpaddd_avx2(auVar7,auVar14);
      auVar35 = vpaddd_avx2(auVar36,auVar35);
      auVar35 = vpaddd_avx2(auVar35,auVar38);
      auVar35 = vpsrad_avx2(auVar35,ZEXT416(uVar2));
      auVar38 = vpslld_avx2(auVar8,auVar33);
      auVar40 = vpslld_avx2(auVar35,auVar33);
      auVar35 = vpunpckldq_avx2(auVar38,auVar40);
      auVar7._4_4_ = iVar16;
      auVar7._0_4_ = iVar16;
      auVar7._8_4_ = iVar16;
      auVar7._12_4_ = iVar16;
      auVar7._16_4_ = iVar16;
      auVar7._20_4_ = iVar16;
      auVar7._24_4_ = iVar16;
      auVar7._28_4_ = iVar16;
      auVar35 = vpaddd_avx2(auVar35,auVar7);
      auVar36 = vpmulld_avx2(auVar35,auVar12);
      if ((long)w + -8 < lVar32) {
        if (iVar4 == 0) {
          auVar35 = vpackusdw_avx2(auVar35,(undefined1  [32])local_e0);
          *(long *)((long)pCVar25 + lVar26) = auVar35._0_8_;
          *(long *)((long)pCVar21 + lVar26) = auVar35._16_8_;
        }
        else {
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)((long)pCVar21 + lVar26);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)((long)pCVar25 + lVar26);
          auVar38._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar39;
          auVar38._16_16_ = ZEXT116(1) * auVar37;
          auVar38 = vpunpcklwd_avx2(auVar38,_DAT_0046a360);
          if (iVar5 == 0) {
            auVar35 = vpaddd_avx2(auVar38,auVar35);
            auVar35 = vpsrad_avx2(auVar35,1);
          }
          else {
            auVar35 = vpmulld_avx2(auVar13,auVar38);
            auVar35 = vpaddd_avx2(auVar36,auVar35);
            auVar35 = vpsrad_avx2(auVar35,4);
          }
          auVar35 = vpaddd_avx2(auVar34,auVar35);
          auVar35 = vpsrad_avx2(auVar35,ZEXT416(uVar27));
          auVar35 = vpackusdw_avx2(auVar35,auVar35);
          auVar8._2_2_ = uVar15;
          auVar8._0_2_ = uVar15;
          auVar8._4_2_ = uVar15;
          auVar8._6_2_ = uVar15;
          auVar8._8_2_ = uVar15;
          auVar8._10_2_ = uVar15;
          auVar8._12_2_ = uVar15;
          auVar8._14_2_ = uVar15;
          auVar8._16_2_ = uVar15;
          auVar8._18_2_ = uVar15;
          auVar8._20_2_ = uVar15;
          auVar8._22_2_ = uVar15;
          auVar8._24_2_ = uVar15;
          auVar8._26_2_ = uVar15;
          auVar8._28_2_ = uVar15;
          auVar8._30_2_ = uVar15;
          auVar35 = vpminsw_avx2(auVar35,auVar8);
          *(long *)((long)puVar22 + lVar26) = auVar35._0_8_;
          *(long *)((long)puVar24 + lVar26) = auVar35._16_8_;
        }
      }
      else {
        auVar38 = vpunpckhdq_avx2(auVar38,auVar40);
        auVar38 = vpaddd_avx2(auVar38,auVar7);
        if (iVar4 == 0) {
          auVar35 = vpackusdw_avx2(auVar35,auVar38);
          *(undefined1 (*) [16])((long)pCVar25 + lVar26) = auVar35._0_16_;
          *(undefined1 (*) [16])((long)pCVar21 + lVar26) = auVar35._16_16_;
        }
        else {
          auVar40._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])((long)pCVar21 + lVar26) +
               ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar25 + lVar26);
          auVar40._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar21 + lVar26);
          auVar7 = vpunpcklwd_avx2(auVar40,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar40 = vpunpckhwd_avx2(auVar40,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          if (iVar5 == 0) {
            auVar35 = vpaddd_avx2(auVar7,auVar35);
            auVar36 = vpsrad_avx2(auVar35,1);
            auVar35 = vpaddd_avx2(auVar38,auVar40);
            auVar35 = vpsrad_avx2(auVar35,1);
          }
          else {
            auVar35 = vpmulld_avx2(auVar13,auVar7);
            auVar35 = vpaddd_avx2(auVar36,auVar35);
            auVar36 = vpsrad_avx2(auVar35,4);
            auVar35 = vpmulld_avx2(auVar13,auVar40);
            auVar38 = vpmulld_avx2(auVar38,auVar12);
            auVar35 = vpaddd_avx2(auVar35,auVar38);
            auVar35 = vpsrad_avx2(auVar35,4);
          }
          auVar36 = vpaddd_avx2(auVar34,auVar36);
          auVar36 = vpsrad_avx2(auVar36,ZEXT416(uVar27));
          auVar35 = vpaddd_avx2(auVar35,auVar34);
          auVar35 = vpsrad_avx2(auVar35,ZEXT416(uVar27));
          auVar35 = vpackusdw_avx2(auVar36,auVar35);
          auVar36._2_2_ = uVar15;
          auVar36._0_2_ = uVar15;
          auVar36._4_2_ = uVar15;
          auVar36._6_2_ = uVar15;
          auVar36._8_2_ = uVar15;
          auVar36._10_2_ = uVar15;
          auVar36._12_2_ = uVar15;
          auVar36._14_2_ = uVar15;
          auVar36._16_2_ = uVar15;
          auVar36._18_2_ = uVar15;
          auVar36._20_2_ = uVar15;
          auVar36._22_2_ = uVar15;
          auVar36._24_2_ = uVar15;
          auVar36._26_2_ = uVar15;
          auVar36._28_2_ = uVar15;
          auVar36._30_2_ = uVar15;
          auVar35 = vpminsw_avx2(auVar35,auVar36);
          *(undefined1 (*) [16])((long)puVar22 + lVar26) = auVar35._0_16_;
          *(undefined1 (*) [16])((long)puVar24 + lVar26) = auVar35._16_16_;
        }
      }
      lVar31 = lVar31 + lVar19 * 4;
      puVar29 = puVar29 + lVar19 * 2;
      pCVar21 = pCVar21 + lVar28 * 2;
      pCVar25 = pCVar25 + lVar28 * 2;
      puVar24 = puVar24 + lVar18 * 2;
      puVar22 = puVar22 + lVar18 * 2;
    }
    lVar26 = lVar26 + 0x10;
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x, const int subpel_x_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_1;

  int i, j;
  __m256i s[4], coeffs_x[4];

  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i zero = _mm256_setzero_si256();

  const __m256i round_const_x =
      _mm256_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);
  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits >= 0);
  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    for (i = 0; i < h; i += 2) {
      const __m256i row0 =
          _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
      __m256i row1 =
          _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

      const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
      const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

      // even pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 0);
      s[1] = _mm256_alignr_epi8(r1, r0, 4);
      s[2] = _mm256_alignr_epi8(r1, r0, 8);
      s[3] = _mm256_alignr_epi8(r1, r0, 12);

      __m256i res_even = convolve(s, coeffs_x);
      res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                  round_shift_x);

      // odd pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 2);
      s[1] = _mm256_alignr_epi8(r1, r0, 6);
      s[2] = _mm256_alignr_epi8(r1, r0, 10);
      s[3] = _mm256_alignr_epi8(r1, r0, 14);

      __m256i res_odd = convolve(s, coeffs_x);
      res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                 round_shift_x);

      res_even = _mm256_sll_epi32(res_even, round_shift_bits);
      res_odd = _mm256_sll_epi32(res_odd, round_shift_bits);

      __m256i res1 = _mm256_unpacklo_epi32(res_even, res_odd);

      __m256i res_unsigned_lo = _mm256_add_epi32(res1, offset_const);

      if (w - j < 8) {
        if (do_average) {
          const __m256i data_0 = _mm256_castsi128_si256(
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
          const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
          const __m256i data_01 =
              _mm256_permute2x128_si256(data_0, data_1, 0x20);

          const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

          const __m256i comp_avg_res = highbd_comp_avg(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);

          const __m256i round_result = highbd_convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_16b =
              _mm256_packus_epi32(round_result, round_result);
          const __m256i res_clip = _mm256_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_0 = _mm256_castsi256_si128(res_clip);
          const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
          _mm_storel_epi64(
              (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
        } else {
          __m256i res_16b =
              _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
          const __m128i res_0 = _mm256_castsi256_si128(res_16b);
          const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                           res_1);
        }
      } else {
        __m256i res2 = _mm256_unpackhi_epi32(res_even, res_odd);
        __m256i res_unsigned_hi = _mm256_add_epi32(res2, offset_const);

        if (do_average) {
          const __m256i data_0 = _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
          const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
          const __m256i data_01 =
              _mm256_permute2x128_si256(data_0, data_1, 0x20);

          const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
          const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

          const __m256i comp_avg_res_lo =
              highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                              use_dist_wtd_comp_avg);
          const __m256i comp_avg_res_hi =
              highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                              use_dist_wtd_comp_avg);

          const __m256i round_result_lo = highbd_convolve_rounding(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m256i round_result_hi = highbd_convolve_rounding(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_16b =
              _mm256_packus_epi32(round_result_lo, round_result_hi);
          const __m256i res_clip = _mm256_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_0 = _mm256_castsi256_si128(res_clip);
          const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                          res_1);
        } else {
          __m256i res_16b =
              _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
          const __m128i res_0 = _mm256_castsi256_si128(res_16b);
          const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                          res_1);
        }
      }
    }
  }
}